

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawListSplitter::ClearFreeMemory(ImDrawListSplitter *this)

{
  undefined8 *puVar1;
  ImDrawChannel *pIVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < (this->_Channels).Size) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (uVar4 == (uint)this->_Current) {
        pIVar2 = (this->_Channels).Data;
        puVar1 = (undefined8 *)((long)&(pIVar2->_IdxBuffer).Size + lVar5);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&(pIVar2->_CmdBuffer).Size + lVar5);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      pIVar2 = (this->_Channels).Data;
      pvVar3 = *(void **)((long)&(pIVar2->_CmdBuffer).Data + lVar5);
      if (pvVar3 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar2->_CmdBuffer).Size + lVar5) = 0;
        ImGui::MemFree(pvVar3);
        *(undefined8 *)((long)&(pIVar2->_CmdBuffer).Data + lVar5) = 0;
      }
      pIVar2 = (this->_Channels).Data;
      pvVar3 = *(void **)((long)&(pIVar2->_IdxBuffer).Data + lVar5);
      if (pvVar3 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar2->_IdxBuffer).Size + lVar5) = 0;
        ImGui::MemFree(pvVar3);
        *(undefined8 *)((long)&(pIVar2->_IdxBuffer).Data + lVar5) = 0;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while ((long)uVar4 < (long)(this->_Channels).Size);
  }
  this->_Current = 0;
  this->_Count = 1;
  pIVar2 = (this->_Channels).Data;
  if (pIVar2 != (ImDrawChannel *)0x0) {
    (this->_Channels).Size = 0;
    (this->_Channels).Capacity = 0;
    ImGui::MemFree(pIVar2);
    (this->_Channels).Data = (ImDrawChannel *)0x0;
  }
  return;
}

Assistant:

void ImDrawListSplitter::ClearFreeMemory()
{
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == _Current)
            memset(&_Channels[i], 0, sizeof(_Channels[i]));  // Current channel is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i]._CmdBuffer.clear();
        _Channels[i]._IdxBuffer.clear();
    }
    _Current = 0;
    _Count = 1;
    _Channels.clear();
}